

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# palette.c
# Opt level: O3

void av1_rd_pick_palette_intra_sbuv
               (AV1_COMP *cpi,MACROBLOCK *x,int dc_mode_cost,uint8_t *best_palette_color_map,
               MB_MODE_INFO *best_mbmi,int64_t *best_rd,int *rate,int *rate_tokenonly,
               int64_t *distortion,uint8_t *skippable)

{
  BLOCK_SIZE bsize;
  byte bVar1;
  byte bVar2;
  uint8_t uVar3;
  int16_t iVar4;
  short sVar5;
  SequenceHeader *pSVar6;
  byte *pbVar7;
  PALETTE_BUFFER *pPVar8;
  byte bVar9;
  byte bVar10;
  PALETTE_MODE_INFO *pPVar11;
  aom_bit_depth_t aVar12;
  uint16_t uVar13;
  int64_t iVar14;
  ulong uVar15;
  int iVar16;
  ushort *puVar17;
  ulong uVar18;
  int16_t *piVar19;
  uint uVar20;
  uint rows;
  uint uVar21;
  long lVar23;
  uint8_t *puVar24;
  uint cols;
  uint uVar25;
  uint8_t *__dest;
  int iVar26;
  uint8_t *puVar27;
  uint16_t *puVar28;
  ulong uVar29;
  ushort uVar30;
  uint uVar31;
  int iVar32;
  int iVar33;
  int iVar34;
  ulong uVar35;
  size_t __n;
  ulong uVar36;
  long lVar37;
  uint uVar38;
  uint8_t *puVar39;
  ulong uVar40;
  int16_t iVar41;
  long lVar42;
  uint uVar43;
  ulong uVar44;
  int iVar45;
  uint8_t *puVar46;
  MACROBLOCK *pMVar47;
  ushort *puVar48;
  ushort uVar49;
  int k;
  uint8_t *puVar50;
  ulong uVar51;
  uint uVar52;
  uint uVar53;
  int16_t *data;
  bool bVar54;
  int colors_threshold_v;
  int colors_threshold_u;
  int colors_u;
  long local_4580;
  byte *local_4578;
  ulong local_4570;
  MACROBLOCK *local_4568;
  MB_MODE_INFO *local_4560;
  uint8_t *local_4558;
  byte *local_4550;
  uint local_4548;
  int local_4544;
  uint local_4540;
  int colors_v;
  ulong local_4538;
  long *local_4530;
  AV1_COMP *local_4528;
  uint8_t *local_4520;
  int16_t centroids [16];
  uint local_44f0;
  uint16_t color_cache [16];
  RD_STATS tokenonly_rd_stats;
  uint8_t *puVar22;
  
  local_4560 = *(x->e_mbd).mi;
  bsize = local_4560->bsize;
  pSVar6 = (cpi->common).seq_params;
  colors_threshold_u = 0;
  colors_threshold_v = 0;
  iVar16 = (x->e_mbd).mb_to_bottom_edge;
  iVar45 = (x->e_mbd).mb_to_right_edge;
  bVar1 = (byte)(x->e_mbd).plane[1].subsampling_x;
  bVar2 = (byte)(x->e_mbd).plane[1].subsampling_y;
  bVar9 = block_size_wide[bsize] >> (bVar1 & 0x1f);
  local_4538 = (ulong)bVar9;
  bVar10 = block_size_high[bsize] >> (bVar2 & 0x1f);
  local_4570 = (ulong)(bVar9 < 4);
  uVar20 = (int)((iVar16 >> 0x1f & iVar16 >> 3) + (uint)block_size_high[bsize]) >> (bVar2 & 0x1f);
  iVar45 = (int)((iVar45 >> 0x1f & iVar45 >> 3) + (uint)block_size_wide[bsize]) >> (bVar1 & 0x1f);
  iVar16 = x->plane[1].src.stride;
  local_4580 = (long)iVar16;
  local_4550 = x->plane[1].src.buf;
  pbVar7 = x->plane[2].src.buf;
  local_4558 = (x->e_mbd).plane[1].color_index_map;
  local_4560->uv_mode = '\0';
  rows = uVar20 + (uint)(bVar10 < 4) * 2;
  puVar22 = (uint8_t *)(ulong)rows;
  cols = iVar45 + (uint)(bVar9 < 4) * 2;
  local_4578 = pbVar7;
  local_4544 = dc_mode_cost;
  local_4530 = best_rd;
  local_4528 = cpi;
  if (pSVar6->use_highbitdepth == '\0') {
    av1_count_colors(local_4550,iVar16,rows,cols,&tokenonly_rd_stats.rate,&colors_u);
    av1_count_colors(pbVar7,iVar16,rows,cols,&tokenonly_rd_stats.rate,&colors_v);
    colors_threshold_u = colors_u;
    colors_threshold_v = colors_v;
  }
  else {
    av1_count_colors_highbd
              (local_4550,iVar16,rows,cols,pSVar6->bit_depth,&tokenonly_rd_stats.rate,
               (int *)color_cache,&colors_threshold_u,&colors_u);
    av1_count_colors_highbd
              (pbVar7,(int)local_4580,rows,cols,pSVar6->bit_depth,&tokenonly_rd_stats.rate,
               (int *)color_cache,&colors_threshold_v,&colors_v);
  }
  uVar52 = (int)local_4538 + (int)local_4570 * 2;
  uVar21 = (uint)bVar10 + (uint)(bVar10 < 4) * 2;
  local_4540 = av1_get_palette_cache(&x->e_mbd,1,color_cache);
  iVar16 = colors_threshold_v;
  if (colors_threshold_v < colors_threshold_u) {
    iVar16 = colors_threshold_u;
  }
  uVar53 = uVar52;
  if (iVar16 - 2U < 0x3f) {
    puVar17 = (ushort *)((long)local_4550 * 2);
    puVar48 = (ushort *)((long)local_4578 * 2);
    uVar3 = pSVar6->use_highbitdepth;
    if (uVar3 == '\0') {
      uVar15 = (ulong)*local_4550;
      uVar25 = (uint)*local_4578;
    }
    else {
      uVar15 = (ulong)*puVar17;
      uVar25 = (uint)*puVar48;
    }
    pPVar8 = x->palette_buffer;
    data = pPVar8->kmeans_data_buf;
    __n = (size_t)(int)cols;
    local_4570 = uVar15;
    uVar31 = uVar25;
    if ((int)rows < 1) {
      iVar16 = (int)uVar15;
    }
    else {
      lVar37 = 0;
      puVar39 = (uint8_t *)0x0;
      pbVar7 = local_4578;
      piVar19 = data;
      do {
        local_4578 = pbVar7;
        if (0 < (int)cols) {
          uVar36 = 0;
          lVar42 = lVar37;
          uVar43 = uVar31;
          do {
            if (uVar3 == '\0') {
              uVar30 = (ushort)local_4550[uVar36];
              uVar49 = (ushort)local_4578[uVar36];
              piVar19[uVar36 * 2] = uVar30;
              lVar23 = lVar42;
            }
            else {
              uVar30 = puVar17[uVar36];
              uVar49 = puVar48[uVar36];
              piVar19[uVar36 * 2] = uVar30;
              lVar23 = (uVar36 + (long)puVar39 * __n) * 2;
            }
            uVar31 = (uint)uVar49;
            uVar38 = (uint)uVar30;
            uVar51 = uVar15;
            if ((uint)uVar15 < uVar38) {
              uVar51 = (ulong)uVar38;
            }
            if (uVar38 < (uint)local_4570) {
              local_4570 = (ulong)uVar38;
              uVar51 = uVar15;
            }
            uVar15 = uVar51;
            uVar38 = uVar25;
            if (uVar25 < uVar31) {
              uVar38 = uVar31;
            }
            if (uVar43 <= uVar31) {
              uVar31 = uVar43;
              uVar25 = uVar38;
            }
            pPVar8->kmeans_data_buf[lVar23 + 1] = uVar49;
            uVar36 = uVar36 + 1;
            lVar42 = lVar42 + 2;
            uVar43 = uVar31;
          } while (cols != uVar36);
        }
        iVar16 = (int)uVar15;
        puVar39 = puVar39 + 1;
        lVar37 = lVar37 + __n * 2;
        piVar19 = piVar19 + __n * 2;
        puVar48 = puVar48 + local_4580;
        puVar17 = puVar17 + local_4580;
        local_4550 = local_4550 + local_4580;
        pbVar7 = local_4578 + local_4580;
      } while (puVar39 != puVar22);
    }
    if (colors_v < colors_u) {
      colors_v = colors_u;
    }
    local_4568 = x;
    local_4548 = uVar52;
    local_4520 = puVar22;
    if (1 < colors_v) {
      uVar43 = 8;
      if ((uint)colors_v < 8) {
        uVar43 = colors_v;
      }
      iVar32 = (int)local_4570;
      local_4580 = CONCAT44(local_4580._4_4_,rows * cols);
      local_4538 = CONCAT71(local_4538._1_7_,bVar10 == uVar20 && (int)local_4538 == iVar45);
      uVar36 = (ulong)uVar52;
      puVar39 = local_4558 + (int)((rows - 1) * uVar52);
      puVar27 = local_4558 + (long)(puVar22 + -1) * __n;
      local_4578 = (byte *)-__n;
      local_4520 = local_4558 + (long)(puVar22 + -1) * uVar36;
      local_4550 = (byte *)-uVar36;
      puVar50 = local_4558 + (long)(int)rows * uVar36;
      uVar15 = (ulong)local_4540;
      pPVar11 = &local_4560->palette_mode_info;
      uVar51 = 2;
      do {
        uVar35 = 0;
        iVar45 = iVar16 - iVar32;
        iVar26 = uVar25 - uVar31;
        do {
          k = (int)uVar51;
          centroids[uVar35 * 2] =
               (short)(((uint)((ulong)((long)iVar45 / (long)k) >> 0x1f) & 1) +
                       (int)((long)iVar45 / (long)k) >> 1) + (short)local_4570;
          centroids[uVar35 * 2 + 1] =
               (short)(((uint)((ulong)((long)iVar26 / (long)k) >> 0x1f) & 1) +
                       (int)((long)iVar26 / (long)k) >> 1) + (short)uVar31;
          uVar35 = uVar35 + 1;
          iVar26 = iVar26 + uVar25 * 2 + uVar31 * -2;
          iVar45 = iVar45 + iVar16 * 2 + iVar32 * -2;
        } while (uVar51 != uVar35);
        av1_k_means_dim2(data,centroids,local_4558,(int)local_4580,k,0x32);
        uVar13 = color_cache[0];
        if (0 < (int)local_4540) {
          aVar12 = ((local_4528->common).seq_params)->bit_depth;
          uVar35 = 0;
          do {
            iVar26 = (int)centroids[uVar35] - (uint)uVar13;
            iVar45 = -iVar26;
            if (0 < iVar26) {
              iVar45 = iVar26;
            }
            if (local_4540 == 1) {
              lVar37 = 0;
            }
            else {
              iVar26 = 0;
              uVar18 = 1;
              iVar33 = iVar45;
              do {
                iVar45 = (int)centroids[uVar35] - (uint)color_cache[uVar18];
                iVar34 = -iVar45;
                if (0 < iVar45) {
                  iVar34 = iVar45;
                }
                iVar45 = iVar34;
                if (iVar33 <= iVar34) {
                  iVar45 = iVar33;
                }
                if (iVar34 < iVar33) {
                  iVar26 = (int)uVar18;
                }
                uVar18 = uVar18 + 1;
                iVar33 = iVar45;
              } while (uVar15 != uVar18);
              lVar37 = (long)iVar26;
            }
            if (iVar45 <= 4 << ((char)aVar12 - AOM_BITS_8 & 0x1f)) {
              centroids[uVar35] = color_cache[lVar37];
            }
            uVar35 = uVar35 + 2;
          } while (uVar35 < uVar51 * 2);
        }
        uVar18 = 2;
        uVar35 = 0;
        do {
          iVar4 = centroids[uVar35];
          uVar29 = uVar35 + 2;
          uVar40 = uVar35 & 0xffffffff;
          uVar44 = uVar18;
          iVar41 = iVar4;
          do {
            sVar5 = centroids[uVar44];
            if (sVar5 < iVar41) {
              uVar40 = uVar44 & 0xffffffff;
            }
            if (sVar5 <= iVar41) {
              iVar41 = sVar5;
            }
            uVar44 = uVar44 + 2;
          } while (uVar44 < uVar51 * 2);
          if (uVar35 != uVar40) {
            iVar41 = centroids[uVar35 + 1];
            lVar37 = (long)(int)uVar40;
            centroids[uVar35] = centroids[lVar37];
            centroids[uVar35 + 1] = centroids[lVar37 + 1];
            centroids[lVar37] = iVar4;
            centroids[lVar37 + 1] = iVar41;
          }
          uVar18 = uVar18 + 2;
          uVar35 = uVar29;
        } while (uVar29 < uVar51 * 2 - 2);
        (*av1_calc_indices_dim2)(data,centroids,local_4558,(int64_t *)0x0,(int)local_4580,k);
        if ((char)local_4538 == '\0') {
          puVar24 = puVar27;
          __dest = local_4520;
          puVar46 = puVar22 + 1;
          if (0 < (int)rows) {
            do {
              memmove(__dest,puVar24,__n);
              memset(__dest + __n,(uint)__dest[__n - 1],(long)(int)(uVar52 - cols));
              puVar46 = puVar46 + -1;
              puVar24 = puVar24 + (long)local_4578;
              __dest = __dest + (long)local_4550;
            } while ((uint8_t *)0x1 < puVar46);
          }
          local_44f0 = (uint)bVar10;
          puVar24 = puVar50;
          lVar37 = (ulong)uVar21 - (long)(int)rows;
          if ((int)uVar20 < (int)local_44f0) {
            do {
              memcpy(puVar24,puVar39,uVar36);
              puVar24 = puVar24 + uVar36;
              lVar37 = lVar37 + -1;
            } while (lVar37 != 0);
          }
        }
        pMVar47 = local_4568;
        (local_4560->palette_mode_info).palette_size[1] = (uint8_t)uVar51;
        uVar3 = pSVar6->use_highbitdepth;
        lVar37 = 1;
        piVar19 = centroids;
        puVar28 = pPVar11->palette_colors;
        do {
          puVar28 = puVar28 + 8;
          uVar35 = 0;
          do {
            uVar30 = piVar19[uVar35 * 2];
            if (uVar3 == '\0') {
              uVar49 = uVar30;
              if ((short)uVar30 < 1) {
                uVar49 = 0;
              }
              if (0xfe < (short)uVar49) {
                uVar49 = 0xff;
              }
            }
            else {
              if (pSVar6->bit_depth == AOM_BITS_10) {
                bVar54 = uVar30 < 0x3ff;
                uVar49 = 0x3ff;
              }
              else if (pSVar6->bit_depth == AOM_BITS_12) {
                bVar54 = uVar30 < 0xfff;
                uVar49 = 0xfff;
              }
              else {
                bVar54 = uVar30 < 0xff;
                uVar49 = 0xff;
              }
              if (bVar54) {
                uVar49 = uVar30;
              }
              if ((short)uVar30 < 0) {
                uVar49 = 0;
              }
            }
            puVar28[uVar35] = uVar49;
            uVar35 = uVar35 + 1;
          } while (uVar51 != uVar35);
          lVar37 = lVar37 + 1;
          piVar19 = piVar19 + 1;
        } while (lVar37 != 3);
        if ((local_4528->sf).intra_sf.early_term_chroma_palette_size_search == 0) {
          av1_txfm_uvrd(local_4528,local_4568,&tokenonly_rd_stats,bsize,*local_4530);
          iVar45 = tokenonly_rd_stats.rate;
          pMVar47 = local_4568;
          if (tokenonly_rd_stats.rate != 0x7fffffff) {
            iVar26 = intra_mode_info_cost_uv(local_4528,local_4568,local_4560,bsize,local_4544);
            iVar26 = iVar26 + iVar45;
            goto LAB_0030c7af;
          }
        }
        else {
          iVar26 = intra_mode_info_cost_uv(local_4528,local_4568,local_4560,bsize,local_4544);
          uVar53 = local_4548;
          if (*local_4530 <= (long)pMVar47->rdmult * (long)iVar26 + 0x100 >> 9) break;
          av1_txfm_uvrd(local_4528,local_4568,&tokenonly_rd_stats,bsize,*local_4530);
          if (tokenonly_rd_stats.rate != 0x7fffffff) {
            iVar26 = tokenonly_rd_stats.rate + iVar26;
            pMVar47 = local_4568;
LAB_0030c7af:
            iVar14 = tokenonly_rd_stats.dist;
            lVar37 = tokenonly_rd_stats.dist * 0x80 +
                     ((long)pMVar47->rdmult * (long)iVar26 + 0x100 >> 9);
            if (lVar37 < *local_4530) {
              *local_4530 = lVar37;
              memcpy(best_mbmi,local_4560,0xb0);
              memcpy(best_palette_color_map,local_4558,(ulong)(uVar21 * uVar52));
              *rate = iVar26;
              *distortion = iVar14;
              *rate_tokenonly = tokenonly_rd_stats.rate;
              *skippable = tokenonly_rd_stats.skip_txfm;
            }
          }
        }
        uVar51 = uVar51 + 1;
        uVar53 = local_4548;
      } while (uVar51 != uVar43 + 1);
    }
  }
  if ((best_mbmi->palette_mode_info).palette_size[1] != '\0') {
    memcpy(local_4558,best_palette_color_map,(ulong)(uVar21 * uVar53));
  }
  return;
}

Assistant:

void av1_rd_pick_palette_intra_sbuv(const AV1_COMP *cpi, MACROBLOCK *x,
                                    int dc_mode_cost,
                                    uint8_t *best_palette_color_map,
                                    MB_MODE_INFO *const best_mbmi,
                                    int64_t *best_rd, int *rate,
                                    int *rate_tokenonly, int64_t *distortion,
                                    uint8_t *skippable) {
  MACROBLOCKD *const xd = &x->e_mbd;
  MB_MODE_INFO *const mbmi = xd->mi[0];
  assert(!is_inter_block(mbmi));
  assert(av1_allow_palette(cpi->common.features.allow_screen_content_tools,
                           mbmi->bsize));
  PALETTE_MODE_INFO *const pmi = &mbmi->palette_mode_info;
  const BLOCK_SIZE bsize = mbmi->bsize;
  const SequenceHeader *const seq_params = cpi->common.seq_params;
  int this_rate;
  int64_t this_rd;
  int colors_u, colors_v;
  int colors_threshold_u = 0, colors_threshold_v = 0, colors_threshold = 0;
  const int src_stride = x->plane[1].src.stride;
  const uint8_t *const src_u = x->plane[1].src.buf;
  const uint8_t *const src_v = x->plane[2].src.buf;
  uint8_t *const color_map = xd->plane[1].color_index_map;
  RD_STATS tokenonly_rd_stats;
  int plane_block_width, plane_block_height, rows, cols;
  av1_get_block_dimensions(bsize, 1, xd, &plane_block_width,
                           &plane_block_height, &rows, &cols);

  mbmi->uv_mode = UV_DC_PRED;
  if (seq_params->use_highbitdepth) {
    int count_buf[1 << 12];      // Maximum (1 << 12) color levels.
    int count_buf_8bit[1 << 8];  // Maximum (1 << 8) bins for hbd path.
    av1_count_colors_highbd(src_u, src_stride, rows, cols,
                            seq_params->bit_depth, count_buf, count_buf_8bit,
                            &colors_threshold_u, &colors_u);
    av1_count_colors_highbd(src_v, src_stride, rows, cols,
                            seq_params->bit_depth, count_buf, count_buf_8bit,
                            &colors_threshold_v, &colors_v);
  } else {
    int count_buf[1 << 8];
    av1_count_colors(src_u, src_stride, rows, cols, count_buf, &colors_u);
    av1_count_colors(src_v, src_stride, rows, cols, count_buf, &colors_v);
    colors_threshold_u = colors_u;
    colors_threshold_v = colors_v;
  }

  uint16_t color_cache[2 * PALETTE_MAX_SIZE];
  const int n_cache = av1_get_palette_cache(xd, 1, color_cache);

  colors_threshold = colors_threshold_u > colors_threshold_v
                         ? colors_threshold_u
                         : colors_threshold_v;
  if (colors_threshold > 1 && colors_threshold <= 64) {
    int r, c, n, i, j;
    const int max_itr = 50;
    int lb_u, ub_u, val_u;
    int lb_v, ub_v, val_v;
    int16_t *const data = x->palette_buffer->kmeans_data_buf;
    int16_t centroids[2 * PALETTE_MAX_SIZE];

    uint16_t *src_u16 = CONVERT_TO_SHORTPTR(src_u);
    uint16_t *src_v16 = CONVERT_TO_SHORTPTR(src_v);
    if (seq_params->use_highbitdepth) {
      lb_u = src_u16[0];
      ub_u = src_u16[0];
      lb_v = src_v16[0];
      ub_v = src_v16[0];
    } else {
      lb_u = src_u[0];
      ub_u = src_u[0];
      lb_v = src_v[0];
      ub_v = src_v[0];
    }

    for (r = 0; r < rows; ++r) {
      for (c = 0; c < cols; ++c) {
        if (seq_params->use_highbitdepth) {
          val_u = src_u16[r * src_stride + c];
          val_v = src_v16[r * src_stride + c];
          data[(r * cols + c) * 2] = val_u;
          data[(r * cols + c) * 2 + 1] = val_v;
        } else {
          val_u = src_u[r * src_stride + c];
          val_v = src_v[r * src_stride + c];
          data[(r * cols + c) * 2] = val_u;
          data[(r * cols + c) * 2 + 1] = val_v;
        }
        if (val_u < lb_u)
          lb_u = val_u;
        else if (val_u > ub_u)
          ub_u = val_u;
        if (val_v < lb_v)
          lb_v = val_v;
        else if (val_v > ub_v)
          ub_v = val_v;
      }
    }

    const int colors = colors_u > colors_v ? colors_u : colors_v;
    const int max_colors =
        colors > PALETTE_MAX_SIZE ? PALETTE_MAX_SIZE : colors;
    for (n = PALETTE_MIN_SIZE; n <= max_colors; ++n) {
      for (i = 0; i < n; ++i) {
        centroids[i * 2] = lb_u + (2 * i + 1) * (ub_u - lb_u) / n / 2;
        centroids[i * 2 + 1] = lb_v + (2 * i + 1) * (ub_v - lb_v) / n / 2;
      }
      av1_k_means(data, centroids, color_map, rows * cols, n, 2, max_itr);
      optimize_palette_colors(color_cache, n_cache, n, 2, centroids,
                              cpi->common.seq_params->bit_depth);
      // Sort the U channel colors in ascending order.
      for (i = 0; i < 2 * (n - 1); i += 2) {
        int min_idx = i;
        int min_val = centroids[i];
        for (j = i + 2; j < 2 * n; j += 2)
          if (centroids[j] < min_val) min_val = centroids[j], min_idx = j;
        if (min_idx != i) {
          int temp_u = centroids[i], temp_v = centroids[i + 1];
          centroids[i] = centroids[min_idx];
          centroids[i + 1] = centroids[min_idx + 1];
          centroids[min_idx] = temp_u, centroids[min_idx + 1] = temp_v;
        }
      }
      av1_calc_indices(data, centroids, color_map, rows * cols, n, 2);
      extend_palette_color_map(color_map, cols, rows, plane_block_width,
                               plane_block_height);
      pmi->palette_size[1] = n;
      for (i = 1; i < 3; ++i) {
        for (j = 0; j < n; ++j) {
          if (seq_params->use_highbitdepth)
            pmi->palette_colors[i * PALETTE_MAX_SIZE + j] = clip_pixel_highbd(
                (int)centroids[j * 2 + i - 1], seq_params->bit_depth);
          else
            pmi->palette_colors[i * PALETTE_MAX_SIZE + j] =
                clip_pixel((int)centroids[j * 2 + i - 1]);
        }
      }

      if (cpi->sf.intra_sf.early_term_chroma_palette_size_search) {
        const int palette_mode_rate =
            intra_mode_info_cost_uv(cpi, x, mbmi, bsize, dc_mode_cost);
        const int64_t header_rd = RDCOST(x->rdmult, palette_mode_rate, 0);
        // Terminate further palette_size search, if header cost corresponding
        // to lower palette_size is more than the best_rd.
        if (header_rd >= *best_rd) break;
        av1_txfm_uvrd(cpi, x, &tokenonly_rd_stats, bsize, *best_rd);
        if (tokenonly_rd_stats.rate == INT_MAX) continue;
        this_rate = tokenonly_rd_stats.rate + palette_mode_rate;
      } else {
        av1_txfm_uvrd(cpi, x, &tokenonly_rd_stats, bsize, *best_rd);
        if (tokenonly_rd_stats.rate == INT_MAX) continue;
        this_rate = tokenonly_rd_stats.rate +
                    intra_mode_info_cost_uv(cpi, x, mbmi, bsize, dc_mode_cost);
      }

      this_rd = RDCOST(x->rdmult, this_rate, tokenonly_rd_stats.dist);
      if (this_rd < *best_rd) {
        *best_rd = this_rd;
        *best_mbmi = *mbmi;
        memcpy(best_palette_color_map, color_map,
               plane_block_width * plane_block_height *
                   sizeof(best_palette_color_map[0]));
        *rate = this_rate;
        *distortion = tokenonly_rd_stats.dist;
        *rate_tokenonly = tokenonly_rd_stats.rate;
        *skippable = tokenonly_rd_stats.skip_txfm;
      }
    }
  }
  if (best_mbmi->palette_mode_info.palette_size[1] > 0) {
    memcpy(color_map, best_palette_color_map,
           plane_block_width * plane_block_height *
               sizeof(best_palette_color_map[0]));
  }
}